

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorImpl<char_const*>::append<std::move_iterator<char_const**>,void>
          (SmallVectorImpl<char_const*> *this,move_iterator<const_char_**> in_start,
          move_iterator<const_char_**> in_end)

{
  ulong uVar1;
  
  uVar1 = (long)in_end._M_current - (long)in_start._M_current >> 3;
  if ((ulong)*(uint *)(this + 0xc) - (ulong)*(uint *)(this + 8) < uVar1) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 0x10,*(uint *)(this + 8) + uVar1,8);
  }
  if (in_end._M_current != in_start._M_current) {
    memmove((void *)((ulong)*(uint *)(this + 8) * 8 + *(long *)this),in_start._M_current,
            (long)in_end._M_current - (long)in_start._M_current);
  }
  if (uVar1 + *(uint *)(this + 8) <= (ulong)*(uint *)(this + 0xc)) {
    *(int *)(this + 8) = (int)(uVar1 + *(uint *)(this + 8));
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }